

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::AddWarning
          (DescriptorBuilder *this,string *element_name,Message *descriptor,ErrorLocation location,
          string *error)

{
  LogMessage *pLVar1;
  LogFinisher local_75 [13];
  LogMessage local_68;
  string *local_30;
  string *error_local;
  Message *pMStack_20;
  ErrorLocation location_local;
  Message *descriptor_local;
  string *element_name_local;
  DescriptorBuilder *this_local;
  
  local_30 = error;
  error_local._4_4_ = location;
  pMStack_20 = descriptor;
  descriptor_local = (Message *)element_name;
  element_name_local = (string *)this;
  if (this->error_collector_ == (ErrorCollector *)0x0) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_WARNING,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0xdae);
    pLVar1 = internal::LogMessage::operator<<(&local_68,&this->filename_);
    pLVar1 = internal::LogMessage::operator<<(pLVar1," ");
    pLVar1 = internal::LogMessage::operator<<(pLVar1,(string *)descriptor_local);
    pLVar1 = internal::LogMessage::operator<<(pLVar1,": ");
    pLVar1 = internal::LogMessage::operator<<(pLVar1,local_30);
    internal::LogFinisher::operator=(local_75,pLVar1);
    internal::LogMessage::~LogMessage(&local_68);
  }
  else {
    (*this->error_collector_->_vptr_ErrorCollector[3])
              (this->error_collector_,&this->filename_,element_name,descriptor,(ulong)location,error
              );
  }
  return;
}

Assistant:

void DescriptorBuilder::AddWarning(
    const string& element_name, const Message& descriptor,
    DescriptorPool::ErrorCollector::ErrorLocation location,
    const string& error) {
  if (error_collector_ == NULL) {
    GOOGLE_LOG(WARNING) << filename_ << " " << element_name << ": " << error;
  } else {
    error_collector_->AddWarning(filename_, element_name, &descriptor, location,
                                 error);
  }
}